

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitops.hpp
# Opt level: O2

uint reference_leading_zeros(uint64_t x)

{
  uint n;
  
  n = 0;
  for (; -1 < (long)x; x = x * 2) {
    n = n + 1;
  }
  return n;
}

Assistant:

unsigned int reference_leading_zeros(uint64_t x) {
    unsigned int n = 0;
    while (!(x & (static_cast<uint64_t>(0x1) << (sizeof(x)*8-1))))
    {
        ++n;
        x <<= 1;
    }
    return n;
}